

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O0

void inner_update_cb_post(update_data *d,float x,float *wref)

{
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  double dVar3;
  float fabs_gradient;
  float gradient;
  float fabs_x;
  float *w;
  float local_30;
  
  dVar3 = std::fabs((double)(ulong)(uint)in_XMM0_Da);
  fVar1 = SUB84(dVar3,0);
  fVar2 = *in_RDI * in_XMM0_Da;
  if (in_RSI[3] <= fVar1 && fVar1 != in_RSI[3]) {
    in_RSI[3] = fVar1;
  }
  dVar3 = std::fabs((double)(ulong)(uint)*in_RDI);
  local_30 = SUB84(dVar3,0);
  if (in_RSI[5] <= local_30 && local_30 != in_RSI[5]) {
    if (local_30 < in_RDI[2] || local_30 == in_RDI[2]) {
      local_30 = in_RDI[2];
    }
    in_RSI[5] = local_30;
  }
  if (in_RSI[5] * in_RSI[3] <= 0.0) {
    *in_RSI = 0.0;
  }
  else {
    *in_RSI = ((in_RDI[1] + in_RSI[4]) * in_RSI[1]) /
              (in_RSI[5] * in_RSI[3] * (in_RSI[5] * in_RSI[3] + in_RSI[2]));
  }
  in_RSI[1] = -fVar2 + in_RSI[1];
  dVar3 = std::fabs((double)(ulong)(uint)fVar2);
  in_RSI[2] = SUB84(dVar3,0) + in_RSI[2];
  in_RSI[4] = -fVar2 * *in_RSI + in_RSI[4];
  return;
}

Assistant:

void inner_update_cb_post(update_data& d, float x, float& wref)
{
  float* w = &wref;
  float fabs_x = fabs(x);
  float gradient = d.update * x;

  if (fabs_x > w[W_MX]) {
    w[W_MX] = fabs_x;
  }

  float fabs_gradient = fabs(d.update);
  if (fabs_gradient > w[W_MG])
    w[W_MG] = fabs_gradient>d.ftrl_beta?fabs_gradient:d.ftrl_beta;

  // COCOB update without sigmoid.
  // If a new Lipschitz constant and/or magnitude of x is found, the w is
  // recalculated and used in the update of the wealth below.
  if (w[W_MG]*w[W_MX]>0)
    w[W_XT] = (d.ftrl_alpha+w[W_WE]) * w[W_ZT]/(w[W_MG]*w[W_MX]*(w[W_MG]*w[W_MX]+w[W_G2]));
  else
    w[W_XT] = 0;

  w[W_ZT] += -gradient;
  w[W_G2] += fabs(gradient);
  w[W_WE] += (-gradient*w[W_XT]);
}